

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_asn1.cc
# Opt level: O0

RSA * RSAPublicKey_dup(RSA *rsa)

{
  int iVar1;
  RSA *pRVar2;
  RSA *ret;
  size_t der_len;
  uint8_t *der;
  RSA *rsa_local;
  
  der = (uint8_t *)rsa;
  iVar1 = RSA_public_key_to_bytes((uint8_t **)&der_len,(size_t *)&ret,(RSA *)rsa);
  if (iVar1 == 0) {
    rsa_local = (RSA *)0x0;
  }
  else {
    pRVar2 = RSA_public_key_from_bytes((uint8_t *)der_len,(size_t)ret);
    OPENSSL_free((void *)der_len);
    rsa_local = pRVar2;
  }
  return (RSA *)rsa_local;
}

Assistant:

RSA *RSAPublicKey_dup(const RSA *rsa) {
  uint8_t *der;
  size_t der_len;
  if (!RSA_public_key_to_bytes(&der, &der_len, rsa)) {
    return NULL;
  }
  RSA *ret = RSA_public_key_from_bytes(der, der_len);
  OPENSSL_free(der);
  return ret;
}